

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O0

char * s3get_gvn_fattr(char *a)

{
  int iVar1;
  bool bVar2;
  int local_14;
  int i;
  char *a_local;
  
  local_14 = 0;
  while( true ) {
    bVar2 = false;
    if (attrib[local_14] != (char *)0x0) {
      iVar1 = strcmp(attrib[local_14],a);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_14 = local_14 + 1;
  }
  if ((attrib[local_14] == (char *)0x0) && (value[local_14] != (char *)0x0)) {
    __assert_fail("(attrib[i] != NULL) || (value[i] == NULL)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                  ,0x5f,"char *s3get_gvn_fattr(char *)");
  }
  return value[local_14];
}

Assistant:

char *
s3get_gvn_fattr(char *a)
{
    int i;

    for (i = 0; attrib[i] && strcmp(attrib[i], a) != 0; i++);

    /* value for sentinel is null as well */
    assert((attrib[i] != NULL) || (value[i] == NULL));

    return value[i];
}